

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  bool bVar1;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  DoWhat local_1c;
  string *psStack_18;
  DoWhat matchBehaviour_local;
  string *testSpec_local;
  TestCaseFilter *this_local;
  
  local_1c = matchBehaviour;
  psStack_18 = testSpec;
  testSpec_local = &this->m_stringToMatch;
  toLower((Catch *)this,testSpec);
  this->m_filterType = local_1c;
  this->m_wildcardPosition = NoWildcard;
  if (this->m_filterType == AutoDetectBehaviour) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"exclude:",&local_41);
    bVar1 = startsWith(&this->m_stringToMatch,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)this);
      std::__cxx11::string::operator=((string *)this,local_78);
      std::__cxx11::string::~string(local_78);
      this->m_filterType = ExcludeTests;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"~",&local_99);
      bVar1 = startsWith(&this->m_stringToMatch,(string *)local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_c0,(ulong)this);
        std::__cxx11::string::operator=((string *)this,local_c0);
        std::__cxx11::string::~string(local_c0);
        this->m_filterType = ExcludeTests;
      }
      else {
        this->m_filterType = IncludeTests;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"*",&local_e1);
  bVar1 = startsWith(&this->m_stringToMatch,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_108,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_108);
    std::__cxx11::string::~string(local_108);
    this->m_wildcardPosition = this->m_wildcardPosition | WildcardAtStart;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"*",&local_129);
  bVar1 = endsWith(&this->m_stringToMatch,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_150,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_150);
    std::__cxx11::string::~string(local_150);
    this->m_wildcardPosition = this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( std::string const& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( toLower( testSpec ) ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( startsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( endsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }